

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * __thiscall
MountPoint::translate(string *__return_storage_ptr__,MountPoint *this,string *path)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  iVar4 = std::__cxx11::string::compare
                    ((ulong)path,0,(char *)(this->root).len_,(ulong)(this->root).str_);
  if (iVar4 == 0) {
    std::__cxx11::string::erase((ulong)path,0);
    iVar4 = std::__cxx11::string::compare((char *)path);
    if ((iVar4 != 0) &&
       ((path->_M_string_length < 3 ||
        (iVar4 = std::__cxx11::string::compare((ulong)path,0,(char *)0x3), iVar4 != 0)))) {
      sVar1 = (this->mountPoint).len_;
      if (sVar1 == 0) {
        local_58 = &local_48;
        local_50 = 0;
        local_48 = 0;
      }
      else {
        pcVar2 = (this->mountPoint).str_;
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + sVar1);
      }
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_28 = *plVar6;
        lStack_20 = plVar5[3];
        local_38 = &local_28;
      }
      else {
        local_28 = *plVar6;
        local_38 = (long *)*plVar5;
      }
      local_30 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_38,(ulong)(path->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_38 != &local_28) {
        operator_delete(local_38,local_28 + 1);
      }
      if (local_58 == &local_48) {
        return __return_storage_ptr__;
      }
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string translate(string& path) const {
    // path must be sub dir of root
    if (path.compare(0, root.len_, root.str_, root.len_) != 0) {
      return string();
    }
    path.erase(0, root.len_);
    if (path == ".." || (path.length() > 2 && path.compare(0, 3, "../") == 0)) {
      return string();
    }
    return mountPoint.AsString() + "/" + path;
  }